

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TToString.h
# Opt level: O2

string * duckdb_apache::thrift::to_string<bool>
                   (string *__return_storage_ptr__,vector<bool,_true> *t)

{
  ostream *poVar1;
  ostringstream o;
  string local_1d0;
  _Bit_const_iterator local_1b0;
  _Bit_const_iterator local_1a0;
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,"[");
  local_1a0.super__Bit_iterator_base._M_p =
       (t->super_vector<bool,_std::allocator<bool>_>).super__Bvector_base<std::allocator<bool>_>.
       _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  local_1a0.super__Bit_iterator_base._M_offset = 0;
  local_1b0.super__Bit_iterator_base._M_p =
       (t->super_vector<bool,_std::allocator<bool>_>).super__Bvector_base<std::allocator<bool>_>.
       _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
  local_1b0.super__Bit_iterator_base._M_offset =
       (t->super_vector<bool,_std::allocator<bool>_>).super__Bvector_base<std::allocator<bool>_>.
       _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
  to_string<std::_Bit_const_iterator>(&local_1d0,&local_1a0,&local_1b0);
  poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
  std::operator<<(poVar1,"]");
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const duckdb::vector<T>& t) {
  std::ostringstream o;
  o << "[" << to_string(t.begin(), t.end()) << "]";
  return o.str();
}